

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::PsbtSignatureData::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData> *in_stack_fffffffffffffe08;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData> *in_stack_fffffffffffffe10;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData> *this;
  char (*in_stack_fffffffffffffe18) [7];
  char (*__args) [10];
  function<void_(cfd::api::json::PsbtSignatureData_&,_const_UniValue_&)> *in_stack_fffffffffffffe20;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>_>_>_>
  *this_00;
  CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData> local_199;
  allocator local_101;
  value_type local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>_>_>_>
                   *)0x6a8a93);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>::CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffe10);
    std::function<std::__cxx11::string(cfd::api::json::PsbtSignatureData_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtSignatureData_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtSignatureData_&)>
                *)in_stack_fffffffffffffe20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtSignatureData_ptr
                *)in_stack_fffffffffffffe18);
    std::function<void(cfd::api::json::PsbtSignatureData&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtSignatureData&,UniValue_const&),void>
              (in_stack_fffffffffffffe20,
               (_func_void_PsbtSignatureData_ptr_UniValue_ptr *)in_stack_fffffffffffffe18);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffe20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe18);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>::operator=
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffe10);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>>>>
            ::
            emplace<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>_>_>_>
                        *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       in_stack_fffffffffffffe10);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"pubkey",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    __args = (char (*) [10])((long)&local_199.set_function.super__Function_base._M_manager + 1);
    std::function<std::__cxx11::string(cfd::api::json::PsbtSignatureData_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::PsbtSignatureData_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::PsbtSignatureData_&)>
                *)in_stack_fffffffffffffe20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_PsbtSignatureData_ptr
                *)__args);
    std::function<void(cfd::api::json::PsbtSignatureData&,UniValue_const&)>::
    function<void(&)(cfd::api::json::PsbtSignatureData&,UniValue_const&),void>
              (in_stack_fffffffffffffe20,(_func_void_PsbtSignatureData_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffffe20,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>::operator=
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>::~CLASS_FUNCTION_TABLE
              (in_stack_fffffffffffffe10);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>>>>
            ::
            emplace<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>&>
                      (this_00,__args,in_stack_fffffffffffffe10);
    local_199.set_function.super__Function_base._M_functor._1_8_ = pVar2.first._M_node;
    local_199.set_function.super__Function_base._M_functor._M_pod_data[9] = pVar2.second;
    this = &local_199;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)local_199.get_function.super__Function_base._M_functor._M_pod_data + 1),
               "signature",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,
                (value_type *)
                ((long)local_199.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::__cxx11::string::~string
              ((string *)
               ((long)local_199.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::PsbtSignatureData>::~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void PsbtSignatureData::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<PsbtSignatureData> func_table;  // NOLINT

  func_table = {
    PsbtSignatureData::GetPubkeyString,
    PsbtSignatureData::SetPubkeyString,
    PsbtSignatureData::GetPubkeyFieldType,
  };
  json_mapper.emplace("pubkey", func_table);
  item_list.push_back("pubkey");
  func_table = {
    PsbtSignatureData::GetSignatureString,
    PsbtSignatureData::SetSignatureString,
    PsbtSignatureData::GetSignatureFieldType,
  };
  json_mapper.emplace("signature", func_table);
  item_list.push_back("signature");
}